

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O2

void __thiscall EventQueue::RemoveAgentsByReceiver(EventQueue *this,void *receiver)

{
  int iVar1;
  undefined4 extraout_var;
  iterator iVar2;
  Node *pNVar3;
  iterator i;
  AutoLock _auto_lock_;
  Node *local_48;
  iterator local_40;
  AutoLock local_38;
  
  AutoLock::AutoLock(&local_38,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,0xa1);
  iVar2.mNode = ((this->mQueue).mHead)->next;
  local_48 = iVar2.mNode;
LAB_00118236:
  if (iVar2.mNode == (this->mQueue).mTail) {
    AutoLock::~AutoLock(&local_38);
    return;
  }
  pNVar3 = iVar2.mNode;
  if (*(int *)&((iVar2.mNode)->val->super_RefCount).field_0xc == -5) {
    iVar1 = (*((iVar2.mNode)->val->super_RefCount)._vptr_RefCount[4])();
    if ((void *)CONCAT44(extraout_var,iVar1) == receiver) goto code_r0x00118257;
    goto LAB_00118280;
  }
  goto LAB_0011828a;
code_r0x00118257:
  RefCount::Release(&local_48->val->super_RefCount);
  JetHead::list<Event_*>::iterator::erase(&local_40);
  local_48 = local_40.mNode;
  iVar2.mNode = local_40.mNode;
  if (local_40.mNode != (Node *)0x0) {
    local_48 = (local_40.mNode)->prev;
LAB_00118280:
    iVar2.mNode = (Node *)0x0;
    pNVar3 = local_48;
    if (local_48 != (Node *)0x0) {
LAB_0011828a:
      iVar2.mNode = pNVar3->next;
      local_48 = iVar2.mNode;
    }
  }
  goto LAB_00118236;
}

Assistant:

void EventQueue::RemoveAgentsByReceiver( void* receiver )
{
	DebugAutoLock( mLock );

	for (JetHead::list<Event*>::iterator i = mQueue.begin(); i != mQueue.end(); ++i)
	{
		if ((*i)->getEventId() == Event::kAgentEventId)
		{
			EventAgent* agent = static_cast<EventAgent*>(*i);
			if (agent->getDeliveryTarget() == receiver)
			{
				(*i)->Release();
				i = i.erase();
				--i;
			}
		}
	}
}